

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zesStandbyGetMode(zes_standby_handle_t hStandby,zes_standby_promo_mode_t *pMode)

{
  zes_pfnStandbyGetMode_t pfnGetMode;
  dditable_t *dditable;
  ze_result_t result;
  zes_standby_promo_mode_t *pMode_local;
  zes_standby_handle_t hStandby_local;
  
  if (*(code **)(*(long *)(hStandby + 8) + 0xb80) == (code *)0x0) {
    hStandby_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hStandby_local._4_4_ =
         (**(code **)(*(long *)(hStandby + 8) + 0xb80))(*(undefined8 *)hStandby,pMode);
  }
  return hStandby_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesStandbyGetMode(
        zes_standby_handle_t hStandby,                  ///< [in] Handle for the component.
        zes_standby_promo_mode_t* pMode                 ///< [in,out] Will contain the current standby mode.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_standby_object_t*>( hStandby )->dditable;
        auto pfnGetMode = dditable->zes.Standby.pfnGetMode;
        if( nullptr == pfnGetMode )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hStandby = reinterpret_cast<zes_standby_object_t*>( hStandby )->handle;

        // forward to device-driver
        result = pfnGetMode( hStandby, pMode );

        return result;
    }